

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btSoftBody.cpp
# Opt level: O2

void __thiscall
btSoftBody::appendTetra(btSoftBody *this,int node0,int node1,int node2,int node3,Material *mat)

{
  Node *pNVar1;
  Tetra *pTVar2;
  Node *pNVar3;
  Node *pNVar4;
  Node *pNVar5;
  long lVar6;
  btVector3 *v2;
  btVector3 bVar7;
  btVector3 bVar8;
  float local_78;
  float local_68;
  float fStack_64;
  btVector3 local_50;
  btVector3 b;
  
  appendTetra(this,-1,mat);
  lVar6 = (long)(this->m_tetras).m_size;
  pNVar1 = (this->m_nodes).m_data;
  pTVar2 = (this->m_tetras).m_data;
  pTVar2[lVar6 + -1].m_n[0] = pNVar1 + node0;
  pNVar3 = (this->m_nodes).m_data;
  pTVar2[lVar6 + -1].m_n[1] = pNVar3 + node1;
  pNVar4 = (this->m_nodes).m_data;
  pTVar2[lVar6 + -1].m_n[2] = pNVar4 + node2;
  pNVar5 = (this->m_nodes).m_data;
  pTVar2[lVar6 + -1].m_n[3] = pNVar5 + node3;
  v2 = &pNVar1[node0].m_x;
  bVar7 = operator-(&pNVar3[node1].m_x,v2);
  b = operator-(&pNVar4[node2].m_x,v2);
  local_50 = operator-(&pNVar5[node3].m_x,v2);
  bVar8 = btVector3::cross(&b,&local_50);
  local_68 = bVar7.m_floats[0];
  fStack_64 = bVar7.m_floats[1];
  local_78 = bVar7.m_floats[2];
  pTVar2[lVar6 + -1].m_rv =
       bVar8.m_floats[2] * local_78 + local_68 * bVar8.m_floats[0] + fStack_64 * bVar8.m_floats[1];
  this->m_bUpdateRtCst = true;
  return;
}

Assistant:

void			btSoftBody::appendTetra(int node0,
										int node1,
										int node2,
										int node3,
										Material* mat)
{
	appendTetra(-1,mat);
	Tetra&	t=m_tetras[m_tetras.size()-1];
	t.m_n[0]	=	&m_nodes[node0];
	t.m_n[1]	=	&m_nodes[node1];
	t.m_n[2]	=	&m_nodes[node2];
	t.m_n[3]	=	&m_nodes[node3];
	t.m_rv		=	VolumeOf(t.m_n[0]->m_x,t.m_n[1]->m_x,t.m_n[2]->m_x,t.m_n[3]->m_x);
	m_bUpdateRtCst=true;
}